

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O3

int __thiscall polyscope::render::ManagedBuffer<int>::getValue(ManagedBuffer<int> *this,size_t ind)

{
  undefined8 *puVar1;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  CanonicalDataSource CVar6;
  int32_t iVar7;
  long *plVar8;
  undefined8 *puVar9;
  pointer piVar10;
  ulong *puVar11;
  size_type *psVar12;
  size_t sVar13;
  element_type *buff;
  ulong uVar14;
  _Alloc_hider _Var15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  uint local_e0;
  undefined4 uStack_dc;
  ulong local_d8 [2];
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if (this->deviceBufferType - Texture1d < 3) {
    ensureHostBufferPopulated(this);
  }
  CVar6 = currentCanonicalDataSource(this);
  if (CVar6 != RenderBuffer) {
    if (CVar6 == NeedsCompute) {
      if ((this->computeFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->computeFunc)._M_invoker)((_Any_data *)&this->computeFunc);
      piVar10 = (this->data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (ind < (ulong)((long)(this->data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar10 >> 2))
      goto LAB_00221aa4;
      std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
      puVar11 = puVar9 + 2;
      if ((ulong *)*puVar9 == puVar11) {
        local_b8 = *puVar11;
        lStack_b0 = puVar9[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *puVar11;
        local_c8 = (ulong *)*puVar9;
      }
      local_c0 = puVar9[1];
      *puVar9 = puVar11;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      cVar5 = '\x01';
      if (9 < ind) {
        sVar13 = ind;
        cVar4 = '\x04';
        do {
          cVar5 = cVar4;
          if (sVar13 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_0022190f;
          }
          if (sVar13 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_0022190f;
          }
          if (sVar13 < 10000) goto LAB_0022190f;
          bVar3 = 99999 < sVar13;
          sVar13 = sVar13 / 10000;
          cVar4 = cVar5 + '\x04';
        } while (bVar3);
        cVar5 = cVar5 + '\x01';
      }
LAB_0022190f:
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct((ulong)&local_e8,cVar5);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e8,local_e0,ind);
      uVar2 = CONCAT44(uStack_dc,local_e0) + local_c0;
      uVar14 = 0xf;
      if (local_c8 != &local_b8) {
        uVar14 = local_b8;
      }
      if (uVar14 < uVar2) {
        uVar14 = 0xf;
        if (local_e8 != local_d8) {
          uVar14 = local_d8[0];
        }
        if (uVar14 < uVar2) goto LAB_00221978;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_c8);
      }
      else {
LAB_00221978:
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_e8);
      }
      local_108 = &local_f8;
      puVar1 = puVar9 + 2;
      if ((undefined8 *)*puVar9 == puVar1) {
        local_f8 = *puVar1;
        uStack_f0 = puVar9[3];
      }
      else {
        local_f8 = *puVar1;
        local_108 = (undefined8 *)*puVar9;
      }
      local_100 = puVar9[1];
      *puVar9 = puVar1;
      puVar9[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
      paVar16 = &local_68.field_2;
      psVar12 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_68.field_2._M_allocated_capacity = *psVar12;
        local_68.field_2._8_8_ = plVar8[3];
        local_68._M_dataplus._M_p = (pointer)paVar16;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar12;
        local_68._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_68._M_string_length = plVar8[1];
      *plVar8 = (long)psVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      exception(&local_68);
      _Var15._M_p = local_68._M_dataplus._M_p;
    }
    else {
      if (CVar6 != HostData) {
        return 0;
      }
      piVar10 = (this->data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (ind < (ulong)((long)(this->data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar10 >> 2))
      goto LAB_00221aa4;
      std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_a8);
      puVar11 = (ulong *)(plVar8 + 2);
      if ((ulong *)*plVar8 == puVar11) {
        local_b8 = *puVar11;
        lStack_b0 = plVar8[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *puVar11;
        local_c8 = (ulong *)*plVar8;
      }
      local_c0 = plVar8[1];
      *plVar8 = (long)puVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      cVar5 = '\x01';
      if (9 < ind) {
        sVar13 = ind;
        cVar4 = '\x04';
        do {
          cVar5 = cVar4;
          if (sVar13 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_002217c8;
          }
          if (sVar13 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_002217c8;
          }
          if (sVar13 < 10000) goto LAB_002217c8;
          bVar3 = 99999 < sVar13;
          sVar13 = sVar13 / 10000;
          cVar4 = cVar5 + '\x04';
        } while (bVar3);
        cVar5 = cVar5 + '\x01';
      }
LAB_002217c8:
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct((ulong)&local_e8,cVar5);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e8,local_e0,ind);
      uVar2 = CONCAT44(uStack_dc,local_e0) + local_c0;
      uVar14 = 0xf;
      if (local_c8 != &local_b8) {
        uVar14 = local_b8;
      }
      if (uVar14 < uVar2) {
        uVar14 = 0xf;
        if (local_e8 != local_d8) {
          uVar14 = local_d8[0];
        }
        if (uVar14 < uVar2) goto LAB_00221831;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_c8);
      }
      else {
LAB_00221831:
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_e8);
      }
      local_108 = &local_f8;
      puVar1 = puVar9 + 2;
      if ((undefined8 *)*puVar9 == puVar1) {
        local_f8 = *puVar1;
        uStack_f0 = puVar9[3];
      }
      else {
        local_f8 = *puVar1;
        local_108 = (undefined8 *)*puVar9;
      }
      local_100 = puVar9[1];
      *puVar9 = puVar1;
      puVar9[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
      paVar16 = &local_48.field_2;
      psVar12 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_48.field_2._M_allocated_capacity = *psVar12;
        local_48.field_2._8_8_ = plVar8[3];
        local_48._M_dataplus._M_p = (pointer)paVar16;
      }
      else {
        local_48.field_2._M_allocated_capacity = *psVar12;
        local_48._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_48._M_string_length = plVar8[1];
      *plVar8 = (long)psVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      exception(&local_48);
      _Var15._M_p = local_48._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var15._M_p != paVar16) {
      operator_delete(_Var15._M_p);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if (local_e8 != local_d8) {
      operator_delete(local_e8);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    piVar10 = (this->data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
LAB_00221aa4:
    return piVar10[ind];
  }
  buff = (this->renderAttributeBuffer).
         super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((long)ind < buff->dataSize) goto LAB_002217b9;
  std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_a8);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_b8 = *puVar11;
    lStack_b0 = plVar8[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar11;
    local_c8 = (ulong *)*plVar8;
  }
  local_c0 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  cVar5 = '\x01';
  if (9 < ind) {
    sVar13 = ind;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (sVar13 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_00221627;
      }
      if (sVar13 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_00221627;
      }
      if (sVar13 < 10000) goto LAB_00221627;
      bVar3 = 99999 < sVar13;
      sVar13 = sVar13 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_00221627:
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct((ulong)&local_e8,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e8,local_e0,ind);
  uVar2 = CONCAT44(uStack_dc,local_e0) + local_c0;
  uVar14 = 0xf;
  if (local_c8 != &local_b8) {
    uVar14 = local_b8;
  }
  if (uVar14 < uVar2) {
    uVar14 = 0xf;
    if (local_e8 != local_d8) {
      uVar14 = local_d8[0];
    }
    if (uVar14 < uVar2) goto LAB_00221690;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_00221690:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_e8);
  }
  local_108 = &local_f8;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_f8 = *puVar1;
    uStack_f0 = puVar9[3];
  }
  else {
    local_f8 = *puVar1;
    local_108 = (undefined8 *)*puVar9;
  }
  local_100 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_88.field_2._M_allocated_capacity = *psVar12;
    local_88.field_2._8_8_ = plVar8[3];
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar12;
    local_88._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_88._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  exception(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  buff = (this->renderAttributeBuffer).
         super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_002217b9:
  iVar7 = getAttributeBufferData<int>(buff,ind);
  return iVar7;
}

Assistant:

T ManagedBuffer<T>::getValue(size_t ind) {

  // For the texture case, always copy to the host and pull from there
  if (deviceBufferTypeIsTexture()) {
    ensureHostBufferPopulated();
  }

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::NeedsCompute:
    computeFunc();
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::RenderBuffer:

    // NOTE: right now this case should never happen unless deviceBufferType == DeviceBufferType::Attribute.
    // In the texture case, we cannot get a single pixel from the backend anyway, so we always
    // call ensureHostBufferPopulated() above and do the host access.

    if (static_cast<int64_t>(ind) >= renderAttributeBuffer->getDataSize())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");

    T val = getAttributeBufferData<T>(*renderAttributeBuffer, ind);
    return val;
    break;
  };

  return T(); // dummy return
}